

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O2

int parse_jobs(pmtr_t *cfg,UT_string *em)

{
  char *yyminor;
  UT_array *pUVar1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  uint *__ptr;
  void *yyp;
  uint uVar5;
  size_t _ut_i;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  void *local_2c8;
  char *tok;
  char *local_2a8;
  uint local_29c;
  parse_t ps;
  size_t toklen;
  size_t len;
  char *buf;
  UT_string *local_258;
  char *local_250;
  job_t job;
  
  __ptr = (uint *)calloc(1,0x30);
  *(size_t *)(__ptr + 2) = 8;
  *(undefined1 **)(__ptr + 4) = (undefined1 *)0x0;
  *(code **)(__ptr + 6) = utarray_str_cpy;
  *(code **)(__ptr + 8) = utarray_str_dtor;
  job_ini(&job);
  ps.line = 1;
  ps.rc = 0;
  ps.em = em;
  ps.job = &job;
  ps.cfg = cfg;
  yyp = ParseAlloc(malloc);
  iVar3 = slurp(cfg->file,&buf,&len);
  if (iVar3 < 0) {
    ps.rc = -1;
    local_2c8 = (void *)0x0;
    uVar9 = 0;
  }
  else {
    lVar6 = 8;
    local_2c8 = (void *)0x0;
    uVar5 = 0;
    local_250 = buf;
    local_2a8 = buf;
    uVar8 = 0;
    local_258 = em;
    while (uVar4 = get_tok(local_250,&local_2a8,&len,&toklen,&ps.line), 0 < (int)uVar4) {
      tok = strndup(local_2a8,toklen);
      uVar9 = uVar8 + 1;
      local_29c = uVar4;
      if (uVar5 < uVar9) {
        while (uVar5 < uVar9) {
          bVar10 = uVar5 == 0;
          uVar5 = uVar5 * 2;
          if (bVar10) {
            uVar5 = 8;
          }
        }
        __ptr[1] = uVar5;
        local_2c8 = realloc(local_2c8,(ulong)uVar5 * lVar6);
        *(void **)(__ptr + 10) = local_2c8;
        if (local_2c8 == (void *)0x0) {
          exit(-1);
        }
      }
      utarray_str_cpy((void *)(lVar6 * (ulong)uVar8 + (long)local_2c8),&tok);
      lVar6 = *(long *)(__ptr + 2);
      local_2c8 = *(void **)(__ptr + 10);
      *__ptr = uVar9;
      free(tok);
      uVar4 = local_29c;
      yyminor = *(char **)((long)local_2c8 + (ulong)uVar8 * lVar6);
      tok = yyminor;
      if (1 < cfg->verbose) {
        printf("token [%s] id=%d line=%d\n",yyminor,(ulong)local_29c,ps._0_8_ & 0xffffffff);
      }
      Parse(yyp,uVar4,yyminor,&ps);
      if (ps.rc == -1) goto LAB_00104e36;
      len = len - toklen;
      local_2a8 = local_2a8 + toklen;
      uVar8 = uVar9;
    }
    uVar9 = uVar8;
    if (uVar4 == 0xffffffff) {
      utstring_printf(local_258,"syntax error in %s line %d",(ps.cfg)->file,ps._0_8_ & 0xffffffff);
      ps.rc = -1;
    }
    else {
      Parse(yyp,0,(char *)0x0,&ps);
      if (ps.rc != -1) {
        pUVar1 = cfg->jobs;
        qsort(pUVar1->d,(ulong)pUVar1->i,(pUVar1->icd).sz,order_sort);
        hash_deps(cfg->jobs);
      }
    }
  }
LAB_00104e36:
  if (__ptr[1] != 0) {
    pcVar2 = *(code **)(__ptr + 8);
    if (pcVar2 != (code *)0x0) {
      for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
        (*pcVar2)((void *)(*(long *)(__ptr + 2) * uVar7 + (long)local_2c8));
      }
      local_2c8 = *(void **)(__ptr + 10);
    }
    free(local_2c8);
  }
  free(__ptr);
  ParseFree(yyp,free);
  free(buf);
  job_fin(&job);
  return ps.rc;
}

Assistant:

int parse_jobs(pmtr_t *cfg, UT_string *em) {
  char *buf, *c, *tok;
  size_t len,toklen;
  UT_array *toks;
  parse_t ps; /* our own parser state */ 
  void *p;    /* lemon parser */
  int id;

  utarray_new(toks,&ut_str_icd);
  job_t job;  /* "scratch" space used when parsing a job */
  job_ini(&job);
  ps.job=&job; 

  ps.cfg=cfg;
  ps.line=1; 
  ps.em=em;
  ps.rc=0;

  p = ParseAlloc(malloc);

  if (slurp(ps.cfg->file, &buf, &len) < 0) {ps.rc=-1; goto done;}
  c = buf;
  while ( (id=get_tok(buf,&c,&len,&toklen,&ps.line)) > 0) {
    tok = strndup(c,toklen); utarray_push_back(toks,&tok); free(tok); 
    tok = *(char**)utarray_back(toks);
    if (cfg->verbose >=2) printf("token [%s] id=%d line=%d\n",tok, id, ps.line);
    Parse(p, id, tok, &ps);
    if (ps.rc == -1) goto done;
    len -= toklen;
    c += toklen;
  }
  if (id == -1) {
    utstring_printf(em,"syntax error in %s line %d", ps.cfg->file, ps.line);
    ps.rc = -1;
    goto done;
  }
  Parse(p, 0, NULL, &ps);
  if (ps.rc == -1) goto done;

  /* parsing succeeded */
  utarray_sort(cfg->jobs, order_sort);
  hash_deps(cfg->jobs);

 done:
  utarray_free(toks);
  ParseFree(p, free);
  if (buf) free(buf);
  job_fin(&job);
  return ps.rc;
}